

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringBuilder.hpp
# Opt level: O2

string * StringBuilder<char[2],char_const&,char_const(&)[2],char_const&>
                   (string *__return_storage_ptr__,char (*arg) [2],char *args,char (*args_1) [2],
                   char *args_2)

{
  string local_60;
  string local_40;
  
  StringBuilder_abi_cxx11_(&local_40,*arg);
  StringBuilder<char,char_const(&)[2],char_const&>(&local_60,args,args_1,args_2);
  std::operator+(__return_storage_ptr__,&local_40,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string StringBuilder(const T & arg, Targs && ... args)
{
    return StringBuilder(arg) + StringBuilder(std::forward<Targs>(args)...);
}